

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  FilterMode minFilter_00;
  FilterMode magFilter_00;
  Context *pCVar1;
  CompareMode CVar2;
  undefined4 uVar3;
  undefined4 wrapS_00;
  TextureType TVar4;
  OffsetSize OVar5;
  GatherType GVar6;
  bool bVar7;
  int iVar8;
  void *pvVar9;
  TestCaseGroup *pTVar10;
  char *pcVar11;
  char *description;
  TextureGatherCase *pTVar12;
  Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4> *pVVar13;
  TextureSwizzleComponent *pTVar14;
  bool bVar15;
  TestCaseGroup *local_630;
  TestCaseGroup *local_618;
  char *local_5f8;
  char *local_5e8;
  TestCaseGroup *local_5d0;
  Vector<int,_3> local_59c;
  MaybeTextureSwizzle local_590;
  TextureFormat local_57c;
  CompareMode local_574;
  TestCaseGroup *pTStack_570;
  CompareMode compareMode_3;
  TestCaseGroup *incompleteGroup;
  MaybeTextureSwizzle local_55c;
  TextureFormat local_548;
  CompareMode local_53c;
  undefined1 local_538 [4];
  CompareMode compareMode_2;
  undefined1 local_518 [8];
  string caseName_3;
  int baseLevel;
  TestCaseGroup *baseLevelGroup;
  MaybeTextureSwizzle local_4dc;
  TextureFormat local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [8];
  string caseName_2;
  CompareMode compareMode_1;
  FilterMode magFilter;
  FilterMode minFilter;
  int magFilterNdx;
  int minFilterNdx;
  anon_struct_16_2_3c8bed26 minFilters [5];
  anon_struct_16_2_3c8bed26 magFilters [2];
  TestCaseGroup *filterModeGroup;
  TextureFormat local_378;
  string local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  int local_30c;
  string local_308 [4];
  int i;
  string caseName_1;
  MaybeTextureSwizzle swizzle;
  int swizzleCaseNdx;
  TestCaseGroup *swizzleGroup;
  TextureFormat local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string caseName;
  WrapMode wrapT;
  WrapMode wrapS;
  int wrapTNdx;
  int wrapSNdx;
  int wrapCaseNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1a9;
  TestCaseGroup *local_1a8;
  TestCaseGroup *local_1a0;
  TestCaseGroup *compareModeGroup;
  CompareMode compareMode;
  int compareModeI;
  TestCaseGroup *textureSizeGroup;
  IVec3 *textureSize;
  int textureSizeNdx;
  TestCaseGroup *local_170;
  TestCaseGroup *cornersGroup;
  bool noCorners;
  TestCaseGroup *pTStack_160;
  int noCornersI;
  TestCaseGroup *formatGroup;
  TextureFormat *format;
  TestCaseGroup *pTStack_148;
  int formatNdx;
  TestCaseGroup *textureTypeGroup;
  int local_138;
  TextureType textureType;
  int textureTypeNdx;
  TestCaseGroup *local_128;
  TestCaseGroup *offsetSizeGroup;
  OffsetSize local_118;
  OffsetSize offsetSize;
  int offsetSizeI;
  TestCaseGroup *local_108;
  TestCaseGroup *gatherTypeGroup;
  GatherType gatherType;
  int gatherTypeI;
  anon_struct_16_2_3f8b7511 wrapModes [3];
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  anon_struct_16_2_3ce319a5 formats [4];
  anon_struct_16_2_3f8ecaa8 textureTypes [3];
  TextureGatherTests *this_local;
  
  textureTypes[2]._8_8_ = this;
  memcpy(&formats[3].format,&DAT_032bea60,0x30);
  textureSizes[1]._16_8_ = (long)"GL_OES_rgb8_rgba8" + 0xc;
  tcu::TextureFormat::TextureFormat((TextureFormat *)formats,RGBA,UNORM_INT8);
  formats[0].format = (TextureFormat)anon_var_dwarf_24977e;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(formats + 1),RGBA,UNSIGNED_INT8);
  formats[1].format = (TextureFormat)anon_var_dwarf_2497ed;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(formats + 2),RGBA,SIGNED_INT8);
  formats[2].format = (TextureFormat)anon_var_dwarf_1cfa92c;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(formats + 3),D,FLOAT);
  wrapModes[2]._8_8_ = anon_var_dwarf_1ac1783;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)textureSizes,0x40,0x40,3);
  textureSizes[0]._16_8_ = anon_var_dwarf_1ac1799;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(textureSizes + 1),0x11,0x17,3);
  pvVar9 = memcpy(&gatherType,&DAT_032bea90,0x30);
  gatherTypeGroup._4_4_ = GATHERTYPE_BASIC;
  while ((int)gatherTypeGroup._4_4_ < 4) {
    gatherTypeGroup._0_4_ = gatherTypeGroup._4_4_;
    pTVar10 = (TestCaseGroup *)operator_new(0x78);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar11 = Functional::anon_unknown_0::gatherTypeName((GatherType)gatherTypeGroup);
    description = Functional::anon_unknown_0::gatherTypeDescription((GatherType)gatherTypeGroup);
    TestCaseGroup::TestCaseGroup(pTVar10,pCVar1,pcVar11,description);
    local_108 = pTVar10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar10);
    for (local_118 = OFFSETSIZE_NONE; (int)local_118 < 3;
        local_118 = local_118 + OFFSETSIZE_MINIMUM_REQUIRED) {
      offsetSizeGroup._4_4_ = local_118;
      if (((GatherType)gatherTypeGroup == GATHERTYPE_BASIC) == (local_118 == OFFSETSIZE_NONE)) {
        textureType._3_1_ = TEXTURETYPE_2D >> 0x18;
        if (local_118 == OFFSETSIZE_NONE) {
          local_5d0 = local_108;
        }
        else {
          local_5d0 = (TestCaseGroup *)operator_new(0x78);
          textureType._3_1_ = 1;
          if (offsetSizeGroup._4_4_ == OFFSETSIZE_MINIMUM_REQUIRED) {
            local_5e8 = "min_required_offset";
          }
          else {
            local_5e8 = (char *)0x0;
            if (offsetSizeGroup._4_4_ == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
              local_5e8 = "implementation_offset";
            }
          }
          if (offsetSizeGroup._4_4_ == OFFSETSIZE_MINIMUM_REQUIRED) {
            local_5f8 = "Use offsets within GL minimum required range";
          }
          else {
            local_5f8 = (char *)0x0;
            if (offsetSizeGroup._4_4_ == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
              local_5f8 = "Use offsets within the implementation range";
            }
          }
          _textureTypeNdx = local_5d0;
          TestCaseGroup::TestCaseGroup
                    (local_5d0,(this->super_TestCaseGroup).m_context,local_5e8,local_5f8);
        }
        local_128 = local_5d0;
        if (local_5d0 != local_108) {
          tcu::TestNode::addChild((TestNode *)local_108,(TestNode *)local_5d0);
        }
        for (local_138 = 0; local_138 < 3; local_138 = local_138 + 1) {
          textureTypeGroup._4_4_ = *(TextureType *)&textureTypes[local_138].name;
          if ((*(TextureType *)&textureTypes[local_138].name != TEXTURETYPE_CUBE) ||
             ((GatherType)gatherTypeGroup == GATHERTYPE_BASIC)) {
            pTVar10 = (TestCaseGroup *)operator_new(0x78);
            TestCaseGroup::TestCaseGroup
                      (pTVar10,(this->super_TestCaseGroup).m_context,
                       (char *)formats[(long)local_138 + 3].format,"");
            pTStack_148 = pTVar10;
            tcu::TestNode::addChild((TestNode *)local_128,(TestNode *)pTVar10);
            for (format._4_4_ = 0; format._4_4_ < 4; format._4_4_ = format._4_4_ + 1) {
              formatGroup = (TestCaseGroup *)(formats + format._4_4_);
              pTVar10 = (TestCaseGroup *)operator_new(0x78);
              TestCaseGroup::TestCaseGroup
                        (pTVar10,(this->super_TestCaseGroup).m_context,
                         (char *)formats[(long)format._4_4_ + -1].format,"");
              pTStack_160 = pTVar10;
              tcu::TestNode::addChild((TestNode *)pTStack_148,(TestNode *)pTVar10);
              for (cornersGroup._4_4_ = 0;
                  cornersGroup._4_4_ <= (int)(uint)(textureTypeGroup._4_4_ == TEXTURETYPE_CUBE);
                  cornersGroup._4_4_ = cornersGroup._4_4_ + 1) {
                cornersGroup._3_1_ = cornersGroup._4_4_ != 0;
                textureSize._7_1_ = 0;
                if (cornersGroup._4_4_ != 0) {
                  local_618 = (TestCaseGroup *)operator_new(0x78);
                  textureSize._7_1_ = 1;
                  _textureSizeNdx = local_618;
                  TestCaseGroup::TestCaseGroup
                            (local_618,(this->super_TestCaseGroup).m_context,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                }
                else {
                  local_618 = pTStack_160;
                }
                local_170 = local_618;
                if (pTStack_160 != local_618) {
                  tcu::TestNode::addChild((TestNode *)pTStack_160,(TestNode *)local_618);
                }
                for (textureSize._0_4_ = 0; (int)textureSize < 2;
                    textureSize._0_4_ = (int)textureSize + 1) {
                  textureSizeGroup = (TestCaseGroup *)(textureSizes + (int)textureSize);
                  pTVar10 = (TestCaseGroup *)operator_new(0x78);
                  TestCaseGroup::TestCaseGroup
                            (pTVar10,(this->super_TestCaseGroup).m_context,
                             *(char **)(textureSizes[(long)(int)textureSize + -1].size.m_data + 2),
                             "");
                  _compareMode = pTVar10;
                  tcu::TestNode::addChild((TestNode *)local_170,(TestNode *)pTVar10);
                  for (compareModeGroup._4_4_ = COMPAREMODE_NONE; (int)compareModeGroup._4_4_ < 9;
                      compareModeGroup._4_4_ = compareModeGroup._4_4_ + COMPAREMODE_LESS) {
                    compareModeGroup._0_4_ = compareModeGroup._4_4_;
                    bVar15 = compareModeGroup._4_4_ != COMPAREMODE_NONE;
                    bVar7 = Functional::anon_unknown_0::isDepthFormat((TextureFormat *)formatGroup);
                    if ((bVar15 == bVar7) &&
                       ((((CompareMode)compareModeGroup == COMPAREMODE_NONE ||
                         ((CompareMode)compareModeGroup == COMPAREMODE_LESS)) ||
                        ((CompareMode)compareModeGroup == COMPAREMODE_GREATER)))) {
                      local_1a9 = 0;
                      bVar7 = (CompareMode)compareModeGroup != COMPAREMODE_NONE;
                      if (bVar7) {
                        local_630 = (TestCaseGroup *)operator_new(0x78);
                        local_1a9 = 1;
                        pCVar1 = (this->super_TestCaseGroup).m_context;
                        local_1a8 = local_630;
                        std::__cxx11::string::string((string *)&wrapCaseNdx);
                        std::operator+(&local_1f0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&wrapCaseNdx,"compare_");
                        pcVar11 = compareModeName((CompareMode)compareModeGroup);
                        std::operator+(&local_1d0,&local_1f0,pcVar11);
                        pcVar11 = (char *)std::__cxx11::string::c_str();
                        TestCaseGroup::TestCaseGroup(local_630,pCVar1,pcVar11,"");
                        local_1a9 = 0;
                      }
                      else {
                        local_630 = _compareMode;
                      }
                      local_1a9 = 0;
                      if (bVar7) {
                        std::__cxx11::string::~string((string *)&local_1d0);
                        std::__cxx11::string::~string((string *)&local_1f0);
                        std::__cxx11::string::~string((string *)&wrapCaseNdx);
                      }
                      local_1a0 = local_630;
                      if (local_630 != _compareMode) {
                        tcu::TestNode::addChild((TestNode *)_compareMode,(TestNode *)local_630);
                      }
                      for (wrapTNdx = 0; wrapTNdx < 3; wrapTNdx = wrapTNdx + 1) {
                        iVar8 = wrapTNdx + 1 + ((wrapTNdx + 1) / 3) * -3;
                        caseName.field_2._12_4_ = *(undefined4 *)&wrapModes[wrapTNdx].name;
                        caseName.field_2._8_4_ = *(undefined4 *)&wrapModes[iVar8].name;
                        std::__cxx11::string::string((string *)&local_2a8);
                        std::operator+(&local_288,&local_2a8,
                                       *(char **)(&gatherType + (long)wrapTNdx * 4));
                        std::operator+(&local_268,&local_288,"_");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_248,&local_268,
                                       *(char **)(&gatherType + (long)iVar8 * 4));
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)&local_288);
                        std::__cxx11::string::~string((string *)&local_2a8);
                        TVar4 = textureTypeGroup._4_4_;
                        pTVar10 = local_1a0;
                        pCVar1 = (this->super_TestCaseGroup).m_context;
                        pcVar11 = (char *)std::__cxx11::string::c_str();
                        GVar6 = (GatherType)gatherTypeGroup;
                        OVar5 = offsetSizeGroup._4_4_;
                        CVar2 = (CompareMode)compareModeGroup;
                        wrapS_00 = caseName.field_2._12_4_;
                        uVar3 = caseName.field_2._8_4_;
                        local_2b0 = (TextureFormat)
                                    (formatGroup->super_TestCaseGroup).super_TestNode._vptr_TestNode
                        ;
                        Functional::anon_unknown_0::MaybeTextureSwizzle::createNoneTextureSwizzle();
                        pTVar12 = Functional::anon_unknown_0::makeTextureGatherCase
                                            (TVar4,pCVar1,pcVar11,"",GVar6,OVar5,local_2b0,CVar2,
                                             wrapS_00,uVar3,
                                             (MaybeTextureSwizzle *)((long)&swizzleGroup + 4),
                                             NEAREST,NEAREST,0,(IVec3 *)textureSizeGroup,
                                             (cornersGroup._3_1_ & 1) * 2);
                        tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTVar12);
                        std::__cxx11::string::~string((string *)local_248);
                      }
                    }
                  }
                }
              }
              if (offsetSizeGroup._4_4_ != OFFSETSIZE_MINIMUM_REQUIRED) {
                bVar7 = Functional::anon_unknown_0::isDepthFormat((TextureFormat *)formatGroup);
                if (!bVar7) {
                  pTVar10 = (TestCaseGroup *)operator_new(0x78);
                  TestCaseGroup::TestCaseGroup
                            (pTVar10,(this->super_TestCaseGroup).m_context,"texture_swizzle","");
                  tcu::TestNode::addChild((TestNode *)pTStack_160,(TestNode *)pTVar10);
                  for (swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_R;
                      (int)swizzle.m_swizzle.m_data[3] < 6;
                      swizzle.m_swizzle.m_data[3] =
                           swizzle.m_swizzle.m_data[3] + TEXTURESWIZZLECOMPONENT_G) {
                    Functional::anon_unknown_0::MaybeTextureSwizzle::createSomeTextureSwizzle();
                    std::__cxx11::string::string(local_308);
                    for (local_30c = 0; TVar4 = textureTypeGroup._4_4_, local_30c < 4;
                        local_30c = local_30c + 1) {
                      iVar8 = swizzle.m_swizzle.m_data[3] + local_30c;
                      pVVar13 = Functional::anon_unknown_0::MaybeTextureSwizzle::getSwizzle
                                          ((MaybeTextureSwizzle *)((long)&caseName_1.field_2 + 8));
                      pTVar14 = tcu::
                                Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4>
                                ::operator[](pVVar13,local_30c);
                      *pTVar14 = iVar8 % 6;
                      pcVar11 = "";
                      if (0 < local_30c) {
                        pcVar11 = "_";
                      }
                      pVVar13 = Functional::anon_unknown_0::MaybeTextureSwizzle::getSwizzle
                                          ((MaybeTextureSwizzle *)((long)&caseName_1.field_2 + 8));
                      pTVar14 = tcu::
                                Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4>
                                ::operator[](pVVar13,local_30c);
                      de::
                      toString<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent>
                                (&local_370,pTVar14);
                      de::toLower(&local_350,&local_370);
                      std::operator+(&local_330,pcVar11,&local_350);
                      std::__cxx11::string::operator+=(local_308,(string *)&local_330);
                      std::__cxx11::string::~string((string *)&local_330);
                      std::__cxx11::string::~string((string *)&local_350);
                      std::__cxx11::string::~string((string *)&local_370);
                    }
                    pCVar1 = (this->super_TestCaseGroup).m_context;
                    pcVar11 = (char *)std::__cxx11::string::c_str();
                    GVar6 = (GatherType)gatherTypeGroup;
                    OVar5 = offsetSizeGroup._4_4_;
                    local_378 = (TextureFormat)
                                (formatGroup->super_TestCaseGroup).super_TestNode._vptr_TestNode;
                    tcu::Vector<int,_3>::Vector
                              ((Vector<int,_3> *)((long)&filterModeGroup + 4),0x40,0x40,3);
                    pTVar12 = Functional::anon_unknown_0::makeTextureGatherCase
                                        (TVar4,pCVar1,pcVar11,"",GVar6,OVar5,local_378,
                                         COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,
                                         (MaybeTextureSwizzle *)((long)&caseName_1.field_2 + 8),
                                         NEAREST,NEAREST,0,(IVec3 *)((long)&filterModeGroup + 4),0);
                    tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTVar12);
                    std::__cxx11::string::~string(local_308);
                  }
                }
                pTVar10 = (TestCaseGroup *)operator_new(0x78);
                TestCaseGroup::TestCaseGroup
                          (pTVar10,(this->super_TestCaseGroup).m_context,"filter_mode",
                           "Test that filter modes have no effect");
                tcu::TestNode::addChild((TestNode *)pTStack_160,(TestNode *)pTVar10);
                minFilters[4]._8_8_ = (long)"linear_mipmap_linear" + 0xe;
                magFilters[0].name = &DAT_00000001;
                magFilters[0]._8_8_ = (long)"linear_mipmap_nearest" + 0xe;
                magFilters[1].name = (char *)0x0;
                memcpy(&magFilterNdx,&DAT_032beae0,0x50);
                for (minFilter = NEAREST; (int)minFilter < 5; minFilter = minFilter + LINEAR) {
                  for (magFilter = NEAREST; (int)magFilter < 2; magFilter = magFilter + LINEAR) {
                    minFilter_00 = *(FilterMode *)&minFilters[(int)minFilter].name;
                    magFilter_00 = *(FilterMode *)&magFilters[(int)magFilter].name;
                    bVar7 = Functional::anon_unknown_0::isDepthFormat((TextureFormat *)formatGroup);
                    caseName_2.field_2._12_4_ = ZEXT14(bVar7);
                    bVar7 = Functional::anon_unknown_0::isUnormFormatType
                                      (*(ChannelType *)
                                        ((long)&(formatGroup->super_TestCaseGroup).super_TestNode.
                                                _vptr_TestNode + 4));
                    if ((((!bVar7) &&
                         (bVar7 = Functional::anon_unknown_0::isDepthFormat
                                            ((TextureFormat *)formatGroup), !bVar7)) ||
                        (magFilter_00 != NEAREST)) &&
                       (((bVar7 = Functional::anon_unknown_0::isUIntFormatType
                                            (*(ChannelType *)
                                              ((long)&(formatGroup->super_TestCaseGroup).
                                                      super_TestNode._vptr_TestNode + 4)), !bVar7 &&
                         (bVar7 = Functional::anon_unknown_0::isSIntFormatType
                                            (*(ChannelType *)
                                              ((long)&(formatGroup->super_TestCaseGroup).
                                                      super_TestNode._vptr_TestNode + 4)), !bVar7))
                        || ((magFilter_00 == NEAREST && (minFilter_00 == NEAREST_MIPMAP_NEAREST)))))
                       ) {
                      std::__cxx11::string::string((string *)&local_4c0);
                      std::operator+(&local_4a0,&local_4c0,"min_");
                      std::operator+(&local_480,&local_4a0,
                                     *(char **)(&magFilterNdx + (long)(int)minFilter * 4));
                      std::operator+(&local_460,&local_480,"_mag_");
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_440,&local_460,
                                     *(char **)&minFilters[(long)(int)magFilter + 4].filter);
                      std::__cxx11::string::~string((string *)&local_460);
                      std::__cxx11::string::~string((string *)&local_480);
                      std::__cxx11::string::~string((string *)&local_4a0);
                      std::__cxx11::string::~string((string *)&local_4c0);
                      TVar4 = textureTypeGroup._4_4_;
                      pCVar1 = (this->super_TestCaseGroup).m_context;
                      pcVar11 = (char *)std::__cxx11::string::c_str();
                      GVar6 = (GatherType)gatherTypeGroup;
                      OVar5 = offsetSizeGroup._4_4_;
                      uVar3 = caseName_2.field_2._12_4_;
                      local_4c8 = (TextureFormat)
                                  (formatGroup->super_TestCaseGroup).super_TestNode._vptr_TestNode;
                      Functional::anon_unknown_0::MaybeTextureSwizzle::createNoneTextureSwizzle();
                      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&baseLevelGroup,0x40,0x40,3);
                      pTVar12 = Functional::anon_unknown_0::makeTextureGatherCase
                                          (TVar4,pCVar1,pcVar11,"",GVar6,OVar5,local_4c8,uVar3,
                                           REPEAT_GL,REPEAT_GL,&local_4dc,minFilter_00,magFilter_00,
                                           0,(IVec3 *)&baseLevelGroup,0);
                      tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTVar12);
                      std::__cxx11::string::~string((string *)local_440);
                    }
                  }
                }
                pTVar10 = (TestCaseGroup *)operator_new(0x78);
                TestCaseGroup::TestCaseGroup
                          (pTVar10,(this->super_TestCaseGroup).m_context,"base_level","");
                tcu::TestNode::addChild((TestNode *)pTStack_160,(TestNode *)pTVar10);
                for (caseName_3.field_2._12_4_ = 1; (int)caseName_3.field_2._12_4_ < 3;
                    caseName_3.field_2._12_4_ = caseName_3.field_2._12_4_ + 1) {
                  de::toString<int>((string *)local_538,
                                    (int *)(caseName_3.field_2._M_local_buf + 0xc));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_518,"level_",(string *)local_538);
                  std::__cxx11::string::~string((string *)local_538);
                  bVar7 = Functional::anon_unknown_0::isDepthFormat((TextureFormat *)formatGroup);
                  TVar4 = textureTypeGroup._4_4_;
                  local_53c = (CompareMode)bVar7;
                  pCVar1 = (this->super_TestCaseGroup).m_context;
                  pcVar11 = (char *)std::__cxx11::string::c_str();
                  GVar6 = (GatherType)gatherTypeGroup;
                  OVar5 = offsetSizeGroup._4_4_;
                  CVar2 = local_53c;
                  local_548 = (TextureFormat)
                              (formatGroup->super_TestCaseGroup).super_TestNode._vptr_TestNode;
                  Functional::anon_unknown_0::MaybeTextureSwizzle::createNoneTextureSwizzle();
                  uVar3 = caseName_3.field_2._12_4_;
                  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&incompleteGroup,0x40,0x40,3);
                  pTVar12 = Functional::anon_unknown_0::makeTextureGatherCase
                                      (TVar4,pCVar1,pcVar11,"",GVar6,OVar5,local_548,CVar2,REPEAT_GL
                                       ,REPEAT_GL,&local_55c,NEAREST,NEAREST,uVar3,
                                       (IVec3 *)&incompleteGroup,0);
                  tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTVar12);
                  std::__cxx11::string::~string((string *)local_518);
                }
                bVar7 = Functional::anon_unknown_0::isDepthFormat((TextureFormat *)formatGroup);
                if (((!bVar7) &&
                    (bVar7 = Functional::anon_unknown_0::isSIntFormatType
                                       (*(ChannelType *)
                                         ((long)&(formatGroup->super_TestCaseGroup).super_TestNode.
                                                 _vptr_TestNode + 4)), !bVar7)) &&
                   (bVar7 = Functional::anon_unknown_0::isUIntFormatType
                                      (*(ChannelType *)
                                        ((long)&(formatGroup->super_TestCaseGroup).super_TestNode.
                                                _vptr_TestNode + 4)), !bVar7)) {
                  pTVar10 = (TestCaseGroup *)operator_new(0x78);
                  TestCaseGroup::TestCaseGroup
                            (pTVar10,(this->super_TestCaseGroup).m_context,"incomplete",
                             "Test that textureGather* takes components from (0,0,0,1) for incomplete textures"
                            );
                  pTStack_570 = pTVar10;
                  tcu::TestNode::addChild((TestNode *)pTStack_160,(TestNode *)pTVar10);
                  bVar7 = Functional::anon_unknown_0::isDepthFormat((TextureFormat *)formatGroup);
                  GVar6 = (GatherType)gatherTypeGroup;
                  OVar5 = offsetSizeGroup._4_4_;
                  TVar4 = textureTypeGroup._4_4_;
                  pTVar10 = pTStack_570;
                  pCVar1 = (this->super_TestCaseGroup).m_context;
                  local_57c = (TextureFormat)
                              (formatGroup->super_TestCaseGroup).super_TestNode._vptr_TestNode;
                  local_574 = (uint)bVar7;
                  Functional::anon_unknown_0::MaybeTextureSwizzle::createNoneTextureSwizzle();
                  tcu::Vector<int,_3>::Vector(&local_59c,0x40,0x40,3);
                  pTVar12 = Functional::anon_unknown_0::makeTextureGatherCase
                                      (TVar4,pCVar1,"mipmap_incomplete","",GVar6,OVar5,local_57c,
                                       (uint)bVar7,REPEAT_GL,REPEAT_GL,&local_590,
                                       NEAREST_MIPMAP_NEAREST,NEAREST,0,&local_59c,1);
                  tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTVar12);
                }
              }
            }
          }
        }
      }
    }
    gatherTypeGroup._4_4_ = gatherTypeGroup._4_4_ + GATHERTYPE_OFFSET;
    pvVar9 = (void *)(ulong)gatherTypeGroup._4_4_;
  }
  return (int)pvVar9;
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_context, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_context,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within GL minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);
			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_context, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_context, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_context, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_context, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_context,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_context, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_context, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_context, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
							}
						}

						// What shadow textures should return for incomplete textures is unclear.
						// Integer and unsigned integer lookups from incomplete textures return undefined values.
						if (!isDepthFormat(format) && !isSIntFormatType(format.type) && !isUIntFormatType(format.type))
						{
							TestCaseGroup* const incompleteGroup = new TestCaseGroup(m_context, "incomplete", "Test that textureGather* takes components from (0,0,0,1) for incomplete textures");
							formatGroup->addChild(incompleteGroup);

							const tcu::Sampler::CompareMode compareMode = isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
							incompleteGroup->addChild(makeTextureGatherCase(textureType, m_context, "mipmap_incomplete", "", gatherType, offsetSize, format,
																			compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST_MIPMAP_NEAREST, tcu::Sampler::NEAREST,
																			0, IVec3(64, 64, 3), GATHERCASE_MIPMAP_INCOMPLETE));
						}
					}
				}
			}
		}
	}
}